

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.y.hpp
# Opt level: O3

void __thiscall deci::parser_t::value_type::move<double>(value_type *this,self_type *that)

{
  double *pdVar1;
  
  pdVar1 = as<double>(that);
  if (this->yytypeid_ == (type_info *)0x0) {
    this->yytypeid_ = (type_info *)&double::typeinfo;
    *(double *)&this->field_0 = *pdVar1;
    as<double>(that);
    that->yytypeid_ = (type_info *)0x0;
    return;
  }
  __assert_fail("!yytypeid_",
                "/workspace/llm4binary/github/license_c_cmakelists/masscry[P]deci/build_O3/iec61131.y.hpp"
                ,0x102,"T &deci::parser_t::value_type::emplace(U &&...) [T = double, U = <double>]")
  ;
}

Assistant:

void
    move (self_type&& that)
    {
      emplace<T> (std::move (that.as<T> ()));
      that.destroy<T> ();
    }